

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

Error * ot::commissioner::TokenManager::PrepareSigningContent
                  (Error *__return_storage_ptr__,ByteArray *aContent,Message *aMessage)

{
  string *this;
  _Rb_tree_header *p_Var1;
  char cVar2;
  Type aTlvType;
  ErrorCode EVar3;
  pointer __dest;
  undefined4 uVar4;
  ByteArray *pBVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  _Rb_tree_node_base *p_Var12;
  pointer puVar13;
  char *to;
  uint uVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer __src;
  format_args args;
  ByteArray content;
  string signingUri;
  writer write;
  TlvSet tlvSet;
  Message message;
  ByteArray local_1b8;
  int local_19c;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  size_t local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  parse_func local_170 [1];
  string local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  ByteArray *local_140;
  writer local_138;
  string local_130;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_110;
  ErrorCode local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  Message local_b8;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_148 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_148;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  coap::Message::Message
            (&local_b8,*(byte *)&aMessage->mHeader >> 2 & kReset,(aMessage->mHeader).mCode);
  p_Var1 = &local_110._M_impl.super__Rb_tree_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140 = aContent;
  local_110._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  coap::Message::GetOption((Error *)local_198,aMessage,&local_168,kUriPath);
  uVar4 = local_198._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != &local_180) {
    operator_delete(local_190._M_p);
  }
  if (uVar4 == none_type) {
    iVar7 = std::__cxx11::string::compare((char *)&local_168);
    iVar8 = std::__cxx11::string::compare((char *)&local_168);
    iVar9 = std::__cxx11::string::compare((char *)&local_168);
    if (iVar9 == 0) {
      pcVar10 = "/c/lp";
LAB_0018ed7e:
      std::__cxx11::string::_M_replace
                ((ulong)&local_168,0,(char *)local_168._M_string_length,(ulong)pcVar10);
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_168);
      if (iVar9 == 0) {
        pcVar10 = "/c/la";
        goto LAB_0018ed7e;
      }
    }
    local_19c = iVar7;
    coap::Message::SetUriPath((Error *)local_198,&local_b8,&local_168);
    __return_storage_ptr__->mCode = local_198._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_190);
    EVar3 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != &local_180) {
      operator_delete(local_190._M_p);
    }
    if (EVar3 == kNone) {
      coap::Message::Serialize((Error *)local_198,&local_b8,&local_1b8);
      __return_storage_ptr__->mCode = local_198._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&local_190);
      EVar3 = __return_storage_ptr__->mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p);
      }
      __dest = local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (EVar3 == kNone) {
        sVar11 = coap::Message::GetHeaderLength(&local_b8);
        if (sVar11 != 0) {
          __src = __dest + sVar11;
          puVar13 = __src;
          if ((long)local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__src != 0) {
            memmove(__dest,__src,
                    (long)local_1b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)__src);
            puVar13 = local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          if (puVar13 != __dest + ((long)puVar13 - (long)__src)) {
            local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = __dest + ((long)puVar13 - (long)__src);
          }
        }
        tlv::GetTlvSet((Error *)local_198,(TlvSet *)&local_110,&aMessage->mPayload,kMeshCoP);
        __return_storage_ptr__->mCode = local_198._0_4_;
        std::__cxx11::string::operator=((string *)this,(string *)&local_190);
        EVar3 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p);
        }
        pBVar5 = local_140;
        iVar7 = local_19c;
        p_Var12 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
        if (EVar3 == kNone) {
          for (; (_Rb_tree_header *)p_Var12 != p_Var1;
              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
            aTlvType = (Type)p_Var12[1]._M_color;
            if (iVar8 == 0) {
              if (aTlvType != 0x34) goto LAB_0018ef81;
            }
            else {
              if (iVar7 == 0) {
LAB_0018ef81:
                bVar6 = tlv::IsDatasetParameter(iVar8 != 0,aTlvType);
                if (!bVar6) goto LAB_0018efa3;
              }
              else {
                uVar14 = aTlvType - 0x3f;
                if ((uVar14 < 8) && ((0x83U >> (uVar14 & 0x1f) & 1) != 0)) goto LAB_0018efa3;
              }
              tlv::Tlv::Serialize((Tlv *)p_Var12[1]._M_parent,&local_1b8);
            }
LAB_0018efa3:
          }
          local_130._M_dataplus._M_p =
               (pointer)(pBVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start;
          (pBVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start =
               local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          (pBVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_finish =
               local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (pBVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)local_130._M_dataplus._M_p == (pointer)0x0) goto LAB_0018eed2;
          goto LAB_0018ed12;
        }
      }
    }
  }
  else {
    local_198._0_4_ = none_type;
    pcVar10 = "the CoAP message has no valid URI Path option";
    local_190._M_p = "the CoAP message has no valid URI Path option";
    local_188 = 0x2d;
    local_180._M_allocated_capacity = 0;
    local_170[0] = (parse_func)0x0;
    local_180._8_8_ = (format_string_checker<char> *)local_198;
    local_138.handler_ = (format_string_checker<char> *)local_198;
    do {
      cVar2 = *pcVar10;
      to = pcVar10;
      while (cVar2 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_138,pcVar10,"");
          goto LAB_0018ec7e;
        }
        cVar2 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_138,pcVar10,to);
      pcVar10 = ::fmt::v10::detail::
                parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                          (to,"",(format_string_checker<char> *)local_198);
    } while (pcVar10 != "");
LAB_0018ec7e:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_198;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_130,(v10 *)"the CoAP message has no valid URI Path option",
               (string_view)ZEXT816(0x2d),args);
    local_e0 = kInvalidArgs;
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    __return_storage_ptr__->mCode = local_e0;
    std::__cxx11::string::operator=((string *)this,(string *)local_d8);
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
LAB_0018ed12:
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if (local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0018eed2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::PrepareSigningContent(ByteArray &aContent, const coap::Message &aMessage)
{
    Error         error;
    coap::Message message{aMessage.GetType(), aMessage.GetCode()};
    tlv::TlvSet   tlvSet;
    std::string   signingUri;
    bool          isActiveSet  = false;
    bool          isPendingSet = false;
    ByteArray     content;

    VerifyOrExit(aMessage.GetUriPath(signingUri) == ErrorCode::kNone,
                 error = ERROR_INVALID_ARGS("the CoAP message has no valid URI Path option"));

    isActiveSet  = signingUri == uri::kMgmtActiveSet;
    isPendingSet = signingUri == uri::kMgmtPendingSet;

    if (signingUri == uri::kPetitioning)
    {
        signingUri = uri::kLeaderPetitioning;
    }
    else if (signingUri == uri::kKeepAlive)
    {
        signingUri = uri::kLeaderKeepAlive;
    }

    // Prepare serialized URI
    SuccessOrExit(error = message.SetUriPath(signingUri));
    SuccessOrExit(error = message.Serialize(content));
    content.erase(content.begin(), content.begin() + message.GetHeaderLength());

    // Sort and serialize TLVs
    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aMessage.GetPayload()));
    for (const auto &tlv : tlvSet)
    {
        if (ShouldBeSerialized(tlv.first, isActiveSet, isPendingSet))
        {
            tlv.second->Serialize(content);
        }
    }

    aContent = std::move(content);

exit:
    return error;
}